

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::split_path
               (char *p,dynamic_string *pDrive,dynamic_string *pDir,dynamic_string *pFilename,
               dynamic_string *pExt)

{
  bool bVar1;
  char cVar2;
  dynamic_string *a;
  long in_RCX;
  dynamic_string *in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_R8;
  char *pBaseName;
  char *pDirName;
  char nametmp [1024];
  char dirtmp [1024];
  undefined7 in_stack_fffffffffffff788;
  char in_stack_fffffffffffff78f;
  dynamic_string *in_stack_fffffffffffff790;
  uint max_len;
  dynamic_string *this;
  char *in_stack_fffffffffffff798;
  dynamic_string *in_stack_fffffffffffff7a0;
  dynamic_string local_858;
  char *local_848;
  char *in_stack_fffffffffffff7c8;
  char local_438 [1032];
  long local_30;
  long local_28;
  dynamic_string *local_20;
  long local_18;
  char *local_10;
  bool local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  strcpy_safe(local_438,0x400,in_RDI);
  strcpy_safe(&stack0xfffffffffffff7c8,0x400,local_10);
  if (local_18 != 0) {
    dynamic_string::clear(in_stack_fffffffffffff790);
  }
  a = (dynamic_string *)dirname(local_438);
  if (a == (dynamic_string *)0x0) {
    local_1 = false;
  }
  else {
    if (local_20 != (dynamic_string *)0x0) {
      dynamic_string::set(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                          (uint)((ulong)in_stack_fffffffffffff790 >> 0x20));
      bVar1 = dynamic_string::is_empty(local_20);
      if ((!bVar1) && (cVar2 = dynamic_string::back(local_20), cVar2 != '/')) {
        dynamic_string::append_char(in_stack_fffffffffffff790,in_stack_fffffffffffff78f);
      }
    }
    max_len = (uint)((ulong)in_stack_fffffffffffff790 >> 0x20);
    local_848 = __xpg_basename(&stack0xfffffffffffff7c8);
    if (local_848 == (char *)0x0) {
      local_1 = false;
    }
    else {
      if (local_28 != 0) {
        dynamic_string::set(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,max_len);
        remove_extension((dynamic_string *)
                         CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
      }
      if (local_30 != 0) {
        dynamic_string::set(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,max_len);
        get_extension((dynamic_string *)
                      CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
        this = &local_858;
        operator+(in_stack_fffffffffffff7c8,a);
        dynamic_string::operator=
                  (this,(dynamic_string *)
                        CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
        dynamic_string::~dynamic_string(this);
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool file_utils::split_path(const char* p, dynamic_string* pDrive, dynamic_string* pDir, dynamic_string* pFilename, dynamic_string* pExt) {
  CRNLIB_ASSERT(p);

#ifdef WIN32
  char drive_buf[_MAX_DRIVE];
  char dir_buf[_MAX_DIR];
  char fname_buf[_MAX_FNAME];
  char ext_buf[_MAX_EXT];

#ifdef _MSC_VER
  // Compiling with MSVC
  errno_t error = _splitpath_s(p,
                               pDrive ? drive_buf : NULL, pDrive ? _MAX_DRIVE : 0,
                               pDir ? dir_buf : NULL, pDir ? _MAX_DIR : 0,
                               pFilename ? fname_buf : NULL, pFilename ? _MAX_FNAME : 0,
                               pExt ? ext_buf : NULL, pExt ? _MAX_EXT : 0);
  if (error != 0)
    return false;
#else
  // Compiling with MinGW
  _splitpath(p,
             pDrive ? drive_buf : NULL,
             pDir ? dir_buf : NULL,
             pFilename ? fname_buf : NULL,
             pExt ? ext_buf : NULL);
#endif

  if (pDrive)
    *pDrive = drive_buf;
  if (pDir)
    *pDir = dir_buf;
  if (pFilename)
    *pFilename = fname_buf;
  if (pExt)
    *pExt = ext_buf;
#else
  char dirtmp[1024];
  char nametmp[1024];
  strcpy_safe(dirtmp, sizeof(dirtmp), p);
  strcpy_safe(nametmp, sizeof(nametmp), p);

  if (pDrive)
    pDrive->clear();

  const char* pDirName = dirname(dirtmp);
  if (!pDirName)
    return false;

  if (pDir) {
    pDir->set(pDirName);
    if ((!pDir->is_empty()) && (pDir->back() != '/'))
      pDir->append_char('/');
  }

  const char* pBaseName = basename(nametmp);
  if (!pBaseName)
    return false;

  if (pFilename) {
    pFilename->set(pBaseName);
    remove_extension(*pFilename);
  }

  if (pExt) {
    pExt->set(pBaseName);
    get_extension(*pExt);
    *pExt = "." + *pExt;
  }
#endif  // #ifdef WIN32

  return true;
}